

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

SVInt slang::ast::slicePacked(PackIterator *iter,PackIterator iterEnd,uint64_t *bit,uint64_t width)

{
  bool bVar1;
  bitwidth_t bVar2;
  SVInt *this;
  unsigned_long *puVar3;
  ulong *in_RCX;
  long in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  long *in_RSI;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  long in_R8;
  SVInt SVar5;
  int32_t in_stack_00000020;
  int32_t in_stack_00000024;
  SVInt *in_stack_00000028;
  uint64_t lsb;
  uint64_t msb;
  SVInt *ci;
  ConstantValue cp;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  ConstantValue *in_stack_ffffffffffffff20;
  ulong uVar6;
  undefined8 in_stack_ffffffffffffff28;
  SVInt *other;
  SVInt *in_stack_ffffffffffffff30;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this_00;
  ulong local_b0;
  unsigned_long local_a8;
  unsigned_long local_a0;
  ulong local_98;
  SVInt *local_90;
  long local_28;
  ulong *local_20;
  long *local_10;
  
  if (*in_RSI == in_RDX) {
    *in_RCX = in_R8 + *in_RCX;
    SVInt::SVInt(in_stack_ffffffffffffff30,(bitwidth_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                 (uint64_t)in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
    uVar4 = extraout_RDX;
  }
  else {
    this_00 = in_RDI;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_10 = in_RSI;
    slang::ConstantValue::ConstantValue
              (in_stack_ffffffffffffff20,
               (ConstantValue *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    bVar1 = slang::ConstantValue::isString((ConstantValue *)0x5c54ae);
    if (bVar1) {
      slang::ConstantValue::convertToInt((ConstantValue *)this_00.pVal);
      slang::ConstantValue::operator=
                (in_stack_ffffffffffffff20,
                 (ConstantValue *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x5c54e4);
    }
    this = slang::ConstantValue::integer((ConstantValue *)0x5c5513);
    local_90 = this;
    bVar2 = SVInt::getBitWidth(this);
    local_98 = ((ulong)bVar2 - *local_20) - 1;
    local_a8 = *local_20 + local_28;
    bVar2 = SVInt::getBitWidth(local_90);
    local_b0 = (ulong)bVar2;
    puVar3 = std::min<unsigned_long>(&local_a8,&local_b0);
    local_a0 = *puVar3;
    bVar2 = SVInt::getBitWidth(local_90);
    local_a0 = bVar2 - local_a0;
    *local_20 = (local_98 - local_a0) + 1 + *local_20;
    other = (SVInt *)*local_20;
    bVar2 = SVInt::getBitWidth(local_90);
    if (other == (SVInt *)(ulong)bVar2) {
      *local_10 = *local_10 + 8;
      *local_20 = 0;
    }
    if ((local_a0 == 0) &&
       (uVar6 = local_98, bVar2 = SVInt::getBitWidth(local_90), uVar6 == bVar2 - 1)) {
      SVInt::SVInt(this,other);
    }
    else {
      SVInt::slice(in_stack_00000028,in_stack_00000024,in_stack_00000020);
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x5c567b);
    uVar4 = extraout_RDX_00;
  }
  SVar5.super_SVIntStorage.bitWidth = (int)uVar4;
  SVar5.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar4 >> 0x20);
  SVar5.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar4 >> 0x28);
  SVar5.super_SVIntStorage._14_2_ = (short)((ulong)uVar4 >> 0x30);
  SVar5.super_SVIntStorage.field_0.val = in_RDI.val;
  return (SVInt)SVar5.super_SVIntStorage;
}

Assistant:

static SVInt slicePacked(PackIterator& iter, const PackIterator iterEnd, uint64_t& bit,
                         uint64_t width) {
    if (iter == iterEnd) {
        // Only for implicit streaming concatenation conversion
        bit += width; // Informs the caller how many zeros are appended.
        return SVInt(bitwidth_t(width), 0, false); // filling with zero bits on the right
    }

    ConstantValue cp = **iter;
    if (cp.isString())
        cp = cp.convertToInt();

    auto& ci = cp.integer();
    SLANG_ASSERT(bit < ci.getBitWidth());
    uint64_t msb = ci.getBitWidth() - bit - 1;
    uint64_t lsb = std::min<uint64_t>(bit + width, ci.getBitWidth());
    lsb = ci.getBitWidth() - lsb;
    bit += msb - lsb + 1;

    SLANG_ASSERT(bit <= ci.getBitWidth());
    if (bit == ci.getBitWidth()) {
        iter++;
        bit = 0;
    }

    if (lsb == 0 && msb == ci.getBitWidth() - 1)
        return std::move(ci);

    return ci.slice(static_cast<int32_t>(msb), static_cast<int32_t>(lsb));
}